

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cSparseTexture2Tests.cpp
# Opt level: O1

bool __thiscall
gl4cts::SparseTexture2CommitmentTestCase::sparseAllocateTexture
          (SparseTexture2CommitmentTestCase *this,Functions *gl,GLint target,GLint format,
          GLuint *texture,GLint levels)

{
  undefined1 *this_00;
  GLenum GVar1;
  ostream *poVar2;
  GLsizei levels_00;
  int iVar3;
  GLint maxLevels;
  int local_3c;
  GLuint *local_38;
  
  this_00 = &(this->super_SparseTextureCommitmentTestCase).field_0x88;
  local_38 = texture;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,"Sparse Allocate [levels: ",0x19);
  poVar2 = (ostream *)std::ostream::operator<<(this_00,levels);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"] - ",4);
  (*(this->super_SparseTextureCommitmentTestCase).super_TestCase.super_TestCase.super_TestNode.
    _vptr_TestNode[7])(this,gl,(ulong)(uint)target,(ulong)(uint)format,local_38);
  iVar3 = 1;
  (*gl->texParameteri)(target,0x91a6,1);
  GVar1 = (*gl->getError)();
  glu::checkError(GVar1,"texParameteri error occurred for GL_TEXTURE_SPARSE_ARB",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTexture2Tests.cpp"
                  ,0x38f);
  (*gl->getTexParameteriv)(target,0x91aa,&local_3c);
  GVar1 = (*gl->getError)();
  glu::checkError(GVar1,"glGetTexParameteriv",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTexture2Tests.cpp"
                  ,0x391);
  if (((target != 0x84f5) && (target != 0x9100)) && (target != 0x9102)) {
    iVar3 = levels;
    if (local_3c < levels) {
      iVar3 = local_3c;
    }
  }
  (this->super_SparseTextureCommitmentTestCase).mState.levels = iVar3;
  levels_00 = ((target & 0xfffffffdU) == 0x9100) + 1;
  (this->super_SparseTextureCommitmentTestCase).mState.samples = levels_00;
  if (levels_00 < iVar3) {
    levels_00 = iVar3;
  }
  gl4cts::Texture::Storage
            (gl,target,levels_00,format,(this->super_SparseTextureCommitmentTestCase).mState.width,
             (this->super_SparseTextureCommitmentTestCase).mState.height,
             (this->super_SparseTextureCommitmentTestCase).mState.depth);
  GVar1 = (*gl->getError)();
  glu::checkError(GVar1,"TexStorage",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTexture2Tests.cpp"
                  ,0x3a7);
  return true;
}

Assistant:

bool SparseTexture2CommitmentTestCase::sparseAllocateTexture(const Functions& gl, GLint target, GLint format,
															 GLuint& texture, GLint levels)
{
	mLog << "Sparse Allocate [levels: " << levels << "] - ";

	prepareTexture(gl, target, format, texture);

	GLint maxLevels;
	gl.texParameteri(target, GL_TEXTURE_SPARSE_ARB, GL_TRUE);
	GLU_EXPECT_NO_ERROR(gl.getError(), "texParameteri error occurred for GL_TEXTURE_SPARSE_ARB");
	gl.getTexParameteriv(target, GL_NUM_SPARSE_LEVELS_ARB, &maxLevels);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetTexParameteriv");
	if (levels > maxLevels)
		levels = maxLevels;

	//GL_TEXTURE_RECTANGLE, GL_TEXTURE_2D_MULTISAMPLE, GL_TEXTURE_2D_MULTISAMPLE_ARRAY can have only one level
	if (target != GL_TEXTURE_RECTANGLE && target != GL_TEXTURE_2D_MULTISAMPLE &&
		target != GL_TEXTURE_2D_MULTISAMPLE_ARRAY)
	{
		mState.levels = levels;
	}
	else
		mState.levels = 1;

	if (target != GL_TEXTURE_2D_MULTISAMPLE && target != GL_TEXTURE_2D_MULTISAMPLE_ARRAY)
	{
		mState.samples = 1;
	}
	else
		mState.samples = 2;

	Texture::Storage(gl, target, deMax32(mState.levels, mState.samples), format, mState.width, mState.height,
					 mState.depth);
	GLU_EXPECT_NO_ERROR(gl.getError(), "TexStorage");

	return true;
}